

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDefines.h
# Opt level: O2

void __thiscall
KDIS::KException::KException<std::__cxx11::string>
          (KException *this,KString *Text,KUINT16 EC,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *AdditonalInfo)

{
  ostream *poVar1;
  KStringStream ss;
  allocator<char> local_1d1;
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  *(undefined ***)this = &PTR__KException_00211c08;
  this->m_ui16ErrorCode = EC;
  (this->m_sErrorText)._M_dataplus._M_p = (pointer)&(this->m_sErrorText).field_2;
  (this->m_sErrorText)._M_string_length = 0;
  (this->m_sErrorText).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,(string *)Text);
  poVar1 = std::operator<<(poVar1,": ");
  switch(EC) {
  case 0:
    std::__cxx11::string::string<std::allocator<char>>(local_1d0,"No Errors. ",&local_1d1);
    break;
  case 1:
    std::__cxx11::string::string<std::allocator<char>>(local_1d0,"Buffer Is Too Small. ",&local_1d1)
    ;
    break;
  case 2:
    std::__cxx11::string::string<std::allocator<char>>
              (local_1d0,"Buffer Does Not Contain Enough Information To Decode. ",&local_1d1);
    break;
  case 3:
    std::__cxx11::string::string<std::allocator<char>>(local_1d0,"String Size Too Big. ",&local_1d1)
    ;
    break;
  case 4:
    std::__cxx11::string::string<std::allocator<char>>
              (local_1d0,"Data Type Is Too Large. ",&local_1d1);
    break;
  case 5:
    std::__cxx11::string::string<std::allocator<char>>
              (local_1d0,"Incorrect PDU Type Specified In Header. ",&local_1d1);
    break;
  case 6:
    std::__cxx11::string::string<std::allocator<char>>
              (local_1d0,"Could Not Open File For Reading/Writing. ",&local_1d1);
    break;
  case 7:
    std::__cxx11::string::string<std::allocator<char>>
              (local_1d0,"Parameter Is Out Of Bounds/Range Of Acceptable Values. ",&local_1d1);
    break;
  case 8:
    std::__cxx11::string::string<std::allocator<char>>(local_1d0,"Invalid Data. ",&local_1d1);
    break;
  case 9:
    std::__cxx11::string::string<std::allocator<char>>
              (local_1d0,"Unsupported Data Type, Can Not Decode. ",&local_1d1);
    break;
  case 10:
    std::__cxx11::string::string<std::allocator<char>>(local_1d0,"Invalid Operation. ",&local_1d1);
    break;
  case 0xb:
    std::__cxx11::string::string<std::allocator<char>>
              (local_1d0,"PDU Is Too Large. PDU Must Not Exceed 8192 Bytes.",&local_1d1);
    break;
  case 0xc:
    std::__cxx11::string::string<std::allocator<char>>(local_1d0,"Socket error.",&local_1d1);
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>(local_1d0,"Unknown KDIS Error. ",&local_1d1);
  }
  poVar1 = std::operator<<(poVar1,local_1d0);
  poVar1 = std::operator<<(poVar1,(string *)&this->m_sErrorText);
  std::operator<<(poVar1,(string *)AdditonalInfo);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_sErrorText,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

KException(const KString &Text, KUINT16 EC, T AdditonalInfo) :
        m_ui16ErrorCode( EC )
    {
        KStringStream ss;
        ss << Text << ": " << GetErrorText( EC ) << m_sErrorText << AdditonalInfo;
        m_sErrorText = ss.str();
    }